

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

bool __thiscall
andres::
BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>
::overlaps<float,false,std::allocator<unsigned_long>>
          (BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>
           *this,View<float,_false,_std::allocator<unsigned_long>_> *v)

{
  bool bVar1;
  
  bVar1 = View<float,true,std::allocator<unsigned_long>>::
          overlaps<float,false,std::allocator<unsigned_long>>
                    (*(View<float,true,std::allocator<unsigned_long>> **)this,v);
  return bVar1;
}

Assistant:

bool overlaps(const View<Tv, isConst, A>& v) const
            { return e_.overlaps(v); }